

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stb_image.cpp
# Opt level: O0

stbi_us * stbi_load_16_from_callbacks
                    (stbi_io_callbacks *clbk,void *user,int *x,int *y,int *channels_in_file,
                    int desired_channels)

{
  stbi__uint16 *psVar1;
  stbi__context s;
  stbi_io_callbacks *in_stack_fffffffffffffef8;
  stbi__context *in_stack_ffffffffffffff00;
  int in_stack_ffffffffffffff3c;
  int *in_stack_ffffffffffffff40;
  int *in_stack_ffffffffffffff48;
  int *in_stack_ffffffffffffff50;
  stbi__context *in_stack_ffffffffffffff58;
  
  stbi__start_callbacks(in_stack_ffffffffffffff00,in_stack_fffffffffffffef8,(void *)0x19ef1f);
  psVar1 = stbi__load_and_postprocess_16bit
                     (in_stack_ffffffffffffff58,in_stack_ffffffffffffff50,in_stack_ffffffffffffff48,
                      in_stack_ffffffffffffff40,in_stack_ffffffffffffff3c);
  return psVar1;
}

Assistant:

STBIDEF stbi_us *stbi_load_16_from_callbacks(stbi_io_callbacks const *clbk, void *user, int *x, int *y, int *channels_in_file, int desired_channels)
{
   stbi__context s;
   stbi__start_callbacks(&s, (stbi_io_callbacks *)clbk, user);
   return stbi__load_and_postprocess_16bit(&s,x,y,channels_in_file,desired_channels);
}